

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_input_auth(connectdata *conn,_Bool proxy,char *auth)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  unsigned_long *puVar4;
  char cVar5;
  Curl_easy *data;
  unsigned_long uVar6;
  _Bool _Var7;
  byte bVar8;
  int iVar9;
  CURLcode CVar10;
  ulong uVar11;
  
  if (*auth != '\0') {
    data = conn->data;
    lVar3 = (ulong)!proxy * 8;
    do {
      iVar9 = curl_strnequal("NTLM",auth,4);
      if (iVar9 == 0) {
        iVar9 = curl_strnequal("Digest",auth,6);
        if (iVar9 == 0) {
          iVar9 = curl_strnequal("Basic",auth,5);
          if (iVar9 == 0) {
            iVar9 = curl_strnequal("Bearer",auth,6);
            if (iVar9 != 0) {
              pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
              *pcVar2 = *pcVar2 | 0x40;
              puVar4 = &(&(data->state).authhost)[proxy].avail;
              *(byte *)puVar4 = (byte)*puVar4 | 0x40;
              if ((&(data->state).authhost)[proxy].picked == 0x40) goto LAB_004919c0;
            }
          }
          else {
            pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
            *pcVar2 = *pcVar2 | 1;
            puVar4 = &(&(data->state).authhost)[proxy].avail;
            *(byte *)puVar4 = (byte)*puVar4 | 1;
            if ((&(data->state).authhost)[proxy].picked == 1) {
LAB_004919c0:
              (&(data->state).authhost)[proxy].avail = 0;
              goto LAB_004919c9;
            }
          }
        }
        else if (((&(data->state).authhost)[proxy].avail & 2) == 0) {
          _Var7 = Curl_auth_is_digest_supported();
          if (_Var7) {
            pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
            *pcVar2 = *pcVar2 | 2;
            puVar4 = &(&(data->state).authhost)[proxy].avail;
            *(byte *)puVar4 = (byte)*puVar4 | 2;
            CVar10 = Curl_input_digest(conn,proxy,auth);
            if (CVar10 != CURLE_OK) goto LAB_004919c9;
          }
        }
        else {
          Curl_infof(data,"Ignoring duplicate digest auth header.\n");
        }
      }
      else if ((((&(data->state).authhost)[proxy].avail & 0x28) != 0) ||
              (_Var7 = Curl_auth_is_ntlm_supported(), _Var7)) {
        pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
        *pcVar2 = *pcVar2 | 8;
        puVar4 = &(&(data->state).authhost)[proxy].avail;
        *(byte *)puVar4 = (byte)*puVar4 | 8;
        uVar6 = (&(data->state).authhost)[proxy].picked;
        if ((uVar6 == 0x20) || (uVar6 == 8)) {
          CVar10 = Curl_input_ntlm(conn,proxy,auth);
          if (CVar10 == CURLE_OK) {
            puVar1 = &(data->state).field_0x4e4;
            *puVar1 = *puVar1 & 0xdf;
          }
          else {
LAB_004919c9:
            Curl_infof(data,"Authentication problem. Ignoring this.\n");
            puVar1 = &(data->state).field_0x4e4;
            *puVar1 = *puVar1 | 0x20;
          }
        }
      }
      for (; (cVar5 = *auth, cVar5 != '\0' && (cVar5 != ',')); auth = auth + 1) {
      }
      uVar11 = (ulong)(cVar5 == ',');
      bVar8 = auth[uVar11];
      while ((bVar8 != 0 && (iVar9 = Curl_isspace((uint)bVar8), iVar9 != 0))) {
        bVar8 = auth[uVar11 + 1];
        uVar11 = uVar11 + 1;
      }
      auth = auth + uVar11;
    } while (*auth != '\0');
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_input_auth(struct connectdata *conn, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct Curl_easy *data = conn->data;

#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
  unsigned long *availp;
  struct auth *authp;

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth)) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(conn, proxy, auth);
          if(!result) {
            DEBUGASSERT(!data->req.newurl);
            data->req.newurl = strdup(data->change.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth)) {
        if((authp->avail & CURLAUTH_NTLM) ||
           (authp->avail & CURLAUTH_NTLM_WB) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM ||
             authp->picked == CURLAUTH_NTLM_WB) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(conn, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
#ifdef NTLM_WB_ENABLED
              if(authp->picked == CURLAUTH_NTLM_WB) {
                *availp &= ~CURLAUTH_NTLM;
                authp->avail &= ~CURLAUTH_NTLM;
                *availp |= CURLAUTH_NTLM_WB;
                authp->avail |= CURLAUTH_NTLM_WB;

                result = Curl_input_ntlm_wb(conn, proxy, auth);
                if(result) {
                  infof(data, "Authentication problem. Ignoring this.\n");
                  data->state.authproblem = TRUE;
                }
              }
#endif
            }
            else {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
        if(checkprefix("Digest", auth)) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.\n");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication isn't activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(conn, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
          if(checkprefix("Basic", auth)) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password isn't
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
          else
            if(checkprefix("Bearer", auth)) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token isn't valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.\n");
                data->state.authproblem = TRUE;
              }
            }

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we're on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}